

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e_aria.c
# Opt level: O0

int aria_ctr_cipher(EVP_CIPHER_CTX *ctx,uchar *out,uchar *in,size_t len)

{
  int iVar1;
  uchar *out_00;
  block128_f in_RCX;
  uchar *in_RDX;
  void *in_RSI;
  EVP_CIPHER_CTX *in_RDI;
  bool bVar2;
  int in_stack_0000000c;
  EVP_CIPHER_CTX *in_stack_00000010;
  EVP_CIPHER_CTX *in_stack_00000020;
  EVP_ARIA_KEY *dat;
  uint num;
  int n;
  uchar *in_stack_ffffffffffffff98;
  uchar *in_00;
  int iVar3;
  block128_f block;
  uint local_4;
  
  iVar1 = EVP_CIPHER_CTX_get_num(in_stack_00000020);
  out_00 = (uchar *)EVP_CIPHER_CTX_get_cipher_data(in_RDI);
  bVar2 = -1 < iVar1;
  if (bVar2) {
    in_00 = in_RDI->iv;
    iVar3 = iVar1;
    block = in_RCX;
    EVP_CIPHER_CTX_buf_noconst(in_RDI);
    CRYPTO_ctr128_encrypt
              (in_00,out_00,(size_t)in_RCX,in_RSI,in_RDX,in_stack_ffffffffffffff98,
               (uint *)CONCAT44(iVar3,iVar1),block);
    EVP_CIPHER_CTX_set_num(in_stack_00000010,in_stack_0000000c);
  }
  local_4 = (uint)bVar2;
  return local_4;
}

Assistant:

static int aria_ctr_cipher(EVP_CIPHER_CTX *ctx, unsigned char *out,
                               const unsigned char *in, size_t len)
{
    int n = EVP_CIPHER_CTX_get_num(ctx);
    unsigned int num;
    EVP_ARIA_KEY *dat = EVP_C_DATA(EVP_ARIA_KEY, ctx);

    if (n < 0)
        return 0;
    num = (unsigned int)n;

    CRYPTO_ctr128_encrypt(in, out, len, &dat->ks, ctx->iv,
                          EVP_CIPHER_CTX_buf_noconst(ctx), &num,
                          (block128_f) ossl_aria_encrypt);
    EVP_CIPHER_CTX_set_num(ctx, num);
    return 1;
}